

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

void BinaryenSIMDShuffleSetLeft(BinaryenExpressionRef expr,BinaryenExpressionRef leftExpr)

{
  if (expr->_id != SIMDShuffleId) {
    __assert_fail("expression->is<SIMDShuffle>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xca0,
                  "void BinaryenSIMDShuffleSetLeft(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (leftExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 1) = leftExpr;
    return;
  }
  __assert_fail("leftExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xca1,
                "void BinaryenSIMDShuffleSetLeft(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenSIMDShuffleSetLeft(BinaryenExpressionRef expr,
                                BinaryenExpressionRef leftExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<SIMDShuffle>());
  assert(leftExpr);
  static_cast<SIMDShuffle*>(expression)->left = (Expression*)leftExpr;
}